

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e mode)

{
  int iVar1;
  ZSTD_sequenceCopier sequenceCopier;
  code *pcStack_10;
  ZSTD_sequenceFormat_e mode_local;
  
  iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam11,mode);
  if (iVar1 == 0) {
    __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x19cf,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)");
  }
  if (mode == ZSTD_sf_explicitBlockDelimiters) {
    pcStack_10 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
  }
  else {
    if (mode != ZSTD_sf_noBlockDelimiters) {
      __assert_fail("sequenceCopier != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x19d5,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)");
    }
    pcStack_10 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
  }
  return pcStack_10;
}

Assistant:

static ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e mode)
{
    ZSTD_sequenceCopier sequenceCopier = NULL;
    assert(ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode));
    if (mode == ZSTD_sf_explicitBlockDelimiters) {
        return ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    } else if (mode == ZSTD_sf_noBlockDelimiters) {
        return ZSTD_copySequencesToSeqStoreNoBlockDelim;
    }
    assert(sequenceCopier != NULL);
    return sequenceCopier;
}